

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

bool __thiscall MeshLib::List<MeshLib::Vertex>::contains(List<MeshLib::Vertex> *this,Vertex *t)

{
  ListNode<MeshLib::Vertex> *pLVar1;
  bool bVar2;
  
  pLVar1 = this->m_head;
  if (pLVar1 == (ListNode<MeshLib::Vertex> *)0x0) {
    return false;
  }
  do {
    bVar2 = pLVar1->m_data == t;
    if (bVar2) {
      return bVar2;
    }
    pLVar1 = pLVar1->m_next;
  } while (pLVar1 != (ListNode<MeshLib::Vertex> *)0x0);
  return bVar2;
}

Assistant:

bool List<T>::contains( T * t )
{
	ListNode<T> * h = m_head;

	if( !h )
	{
		return false;
	}
	
	do{
		if( h->data() == t ) return true;
		h = h->next();
	}while( h != NULL );

	return false;
}